

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O3

int __thiscall
Imf_2_5::
TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
copy(TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Attribute *this_00;
  
  this_00 = (Attribute *)operator_new(0x28);
  this_00->_vptr_Attribute = (_func_int **)0x0;
  this_00[1]._vptr_Attribute = (_func_int **)0x0;
  this_00[2]._vptr_Attribute = (_func_int **)0x0;
  this_00[3]._vptr_Attribute = (_func_int **)0x0;
  this_00[4]._vptr_Attribute = (_func_int **)0x0;
  Attribute::Attribute(this_00);
  this_00->_vptr_Attribute = (_func_int **)&PTR__TypedAttribute_003cb830;
  this_00[1]._vptr_Attribute = (_func_int **)(this_00 + 3);
  this_00[2]._vptr_Attribute = (_func_int **)0x0;
  *(undefined1 *)&this_00[3]._vptr_Attribute = 0;
  cast(&this->super_Attribute);
  std::__cxx11::string::_M_assign((string *)(this_00 + 1));
  return (int)this_00;
}

Assistant:

Attribute *
TypedAttribute<T>::copy () const
{
    Attribute * attribute = new TypedAttribute<T>();
    attribute->copyValueFrom (*this);
    return attribute;
}